

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# http.c++
# Opt level: O0

Promise<kj::HttpServer::Connection::LoopResult> __thiscall
kj::HttpServer::Connection::sendError(Connection *this,ProtocolError protocolError)

{
  HttpServerErrorHandler *pHVar1;
  ProtocolError *pPVar2;
  Promise<void> *pPVar3;
  Promise<void> *in_RSI;
  Promise<void> local_60;
  undefined8 local_58;
  char *pcStack_50;
  size_t local_48;
  char *pcStack_40;
  size_t local_38;
  char *pcStack_30;
  size_t local_28;
  Promise<void> local_20;
  Promise<void> promise;
  Connection *this_local;
  
  *(undefined1 *)((long)&in_RSI[0x2c].super_PromiseBase.node.ptr + 4) = 1;
  pHVar1 = Maybe<kj::HttpServerErrorHandler_&>::orDefault
                     ((Maybe<kj::HttpServerErrorHandler_&> *)
                      (in_RSI[3].super_PromiseBase.node.ptr + 5),
                      (HttpServerErrorHandler *)(in_RSI + 2));
  pPVar2 = mv<kj::HttpHeaders::ProtocolError>(&protocolError);
  local_28 = (pPVar2->rawContent).size_;
  local_58 = *(undefined8 *)pPVar2;
  pcStack_50 = (pPVar2->statusMessage).content.ptr;
  local_48 = (pPVar2->statusMessage).content.size_;
  pcStack_40 = (pPVar2->description).content.ptr;
  local_38 = (pPVar2->description).content.size_;
  pcStack_30 = (pPVar2->rawContent).ptr;
  (**pHVar1->_vptr_HttpServerErrorHandler)(&local_20,pHVar1,in_RSI);
  pPVar3 = mv<kj::Promise<void>>(&local_20);
  Promise<void>::Promise(&local_60,pPVar3);
  finishSendingError(this,in_RSI);
  Promise<void>::~Promise(&local_60);
  Promise<void>::~Promise(&local_20);
  return (PromiseBase)(PromiseBase)this;
}

Assistant:

kj::Promise<LoopResult> sendError(HttpHeaders::ProtocolError protocolError) {
    closeAfterSend = true;

    // Client protocol errors always happen on request headers parsing, before we call into the
    // HttpService, meaning no response has been sent and we can provide a Response object.
    auto promise = server.settings.errorHandler.orDefault(*this).handleClientProtocolError(
        kj::mv(protocolError), *this);
    return finishSendingError(kj::mv(promise));
  }